

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O3

void __thiscall VRle::Data::opGeneric(Data *this,Data *aObj,Data *bObj,Op op)

{
  short sVar1;
  short sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Span *pSVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  pointer pSVar8;
  Span *pSVar13;
  Span *__first;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  Span *pSVar18;
  size_t sVar19;
  Span *pSVar20;
  Span *pSVar21;
  long lVar22;
  Span *pSVar23;
  Result result;
  rle_view local_858;
  Op local_844;
  rle_view local_840;
  long local_830;
  Span local_828 [255];
  
  pSVar13 = (aObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar23 = (aObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_830 = (long)pSVar23 - (long)pSVar13;
  sVar17 = local_830 >> 3;
  __first = (bObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar7 = (bObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar22 = (long)pSVar7 - (long)__first;
  sVar19 = lVar22 >> 3;
  local_858._data = __first;
  local_858._size = sVar19;
  local_844 = op;
  local_840._data = pSVar13;
  local_840._size = sVar17;
  std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,sVar17 + sVar19);
  updateBbox(aObj);
  uVar3 = (aObj->mBbox).x1;
  uVar9 = (aObj->mBbox).y1;
  uVar4 = (aObj->mBbox).x2;
  uVar10 = (aObj->mBbox).y2;
  updateBbox(bObj);
  uVar5 = (bObj->mBbox).x1;
  uVar11 = (bObj->mBbox).y1;
  uVar6 = (bObj->mBbox).x2;
  uVar12 = (bObj->mBbox).y2;
  if ((((int)uVar3 < (int)uVar6 && (int)uVar5 < (int)uVar4) && ((int)uVar11 < (int)uVar10)) &&
     ((int)uVar9 < (int)uVar12)) {
    pSVar18 = __first;
    pSVar20 = pSVar13;
    pSVar21 = pSVar13;
    if (pSVar13 != pSVar23) {
      sVar1 = __first->y;
      lVar22 = 0;
      do {
        sVar2 = pSVar20->y;
        if (sVar1 <= sVar2) {
          pSVar21 = (Span *)((long)pSVar13 - lVar22);
          if (lVar22 == 0) goto LAB_00111e2e;
          goto LAB_00111dc9;
        }
        pSVar20 = pSVar20 + 1;
        lVar22 = lVar22 + -8;
      } while (pSVar20 != pSVar23);
      pSVar21 = (Span *)((long)pSVar13 - lVar22);
LAB_00111dc9:
      pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) +
               ((long)pSVar21 - (long)pSVar13 >> 3);
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
          uVar16) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar16);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (pSVar13,(Span *)(((long)pSVar21 - (long)pSVar13) + (long)pSVar13),
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
      if (sVar1 <= sVar2) {
LAB_00111e2e:
        if (__first != pSVar7) {
          lVar22 = 0;
          pSVar13 = __first;
          do {
            if (pSVar20->y <= pSVar13->y) {
              pSVar18 = (Span *)((long)__first - lVar22);
              if (lVar22 == 0) goto LAB_00111ecb;
              goto LAB_00111e6d;
            }
            pSVar13 = pSVar13 + 1;
            lVar22 = lVar22 + -8;
          } while (pSVar13 != pSVar7);
          pSVar18 = (Span *)((long)__first - lVar22);
LAB_00111e6d:
          pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar16 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) +
                   ((long)pSVar18 - (long)__first >> 3);
          if ((ulong)((long)(this->mSpans).
                            super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) < uVar16)
          {
            std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar16);
          }
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                    (__first,(Span *)(((long)pSVar18 - (long)__first) + (long)__first),
                     (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)
                     this);
          __first = pSVar13;
        }
      }
    }
LAB_00111ecb:
    local_840._size = (long)pSVar23 - (long)pSVar21 >> 3;
    local_858._size = (long)pSVar7 - (long)pSVar18 >> 3;
    lVar22 = 0;
    do {
      *(undefined4 *)((long)&local_828[0].y + lVar22 + 1) = 0;
      *(undefined4 *)((long)&local_828[0].x + lVar22) = 0;
      lVar22 = lVar22 + 8;
    } while (lVar22 != 0x7f8);
    local_858._data = __first;
    local_840._data = pSVar20;
    if (pSVar21 == pSVar23) {
LAB_00111f13:
      sVar17 = local_858._size;
      pSVar13 = local_858._data;
      if (local_858._size == 0) goto LAB_00111d8e;
      pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) +
               local_858._size;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
          uVar16) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar16);
      }
      pSVar23 = pSVar13 + sVar17;
    }
    else {
      if (local_858._size != 0) {
        do {
          sVar17 = _opGeneric(&local_840,&local_858,(Result *)local_828,local_844);
          if (sVar17 != 0) {
            pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar16 = ((long)(this->mSpans).
                            super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) + sVar17;
            if ((ulong)((long)(this->mSpans).
                              super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
                uVar16) {
              std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar16);
            }
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                      (local_828,local_828 + sVar17,
                       (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)
                       this);
          }
          if (local_840._size == 0) goto LAB_00111f13;
        } while (local_858._size != 0);
      }
      sVar17 = local_840._size;
      pSVar13 = local_840._data;
      pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) +
               local_840._size;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
          uVar16) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar16);
      }
      pSVar23 = pSVar13 + sVar17;
    }
  }
  else {
    pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3;
    lVar14 = (long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3;
    if (pSVar13->y < __first->y) {
      uVar15 = lVar14 + sVar17;
      if (uVar16 < uVar15) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar15);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (pSVar13,(Span *)((long)&pSVar13->x + local_830),
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
      pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) + sVar19;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
          uVar16) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar16);
      }
      pSVar23 = (Span *)(lVar22 + (long)__first);
      pSVar13 = __first;
    }
    else {
      uVar15 = lVar14 + sVar19;
      if (uVar16 < uVar15) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar15);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (__first,(Span *)(lVar22 + (long)__first),
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
      pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) + sVar17;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
          uVar16) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar16);
      }
      pSVar23 = (Span *)((long)&pSVar13->x + local_830);
    }
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
            (pSVar13,pSVar23,
             (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
LAB_00111d8e:
  this->mBboxDirty = true;
  return;
}

Assistant:

void VRle::Data::opGeneric(const VRle::Data &aObj, const VRle::Data &bObj,
                           Op op)
{
    // This routine assumes, obj1(span_y) < obj2(span_y).

    auto a = aObj.view();
    auto b = bObj.view();

    // reserve some space for the result vector.
    mSpans.reserve(a.size() + b.size());

    // if two rle are disjoint
    if (!aObj.bbox().intersects(bObj.bbox())) {
        if (a.data()[0].y < b.data()[0].y) {
            copy(a.data(), a.size(), mSpans);
            copy(b.data(), b.size(), mSpans);
        } else {
            copy(b.data(), b.size(), mSpans);
            copy(a.data(), a.size(), mSpans);
        }
    } else {
        auto aPtr = a.data();
        auto aEnd = a.data() + a.size();
        auto bPtr = b.data();
        auto bEnd = b.data() + b.size();

        // 1. forward a till it intersects with b
        while ((aPtr != aEnd) && (aPtr->y < bPtr->y)) aPtr++;

        auto count = aPtr - a.data();
        if (count) copy(a.data(), count, mSpans);

        // 2. forward b till it intersects with a
        if (aPtr != aEnd)
            while ((bPtr != bEnd) && (bPtr->y < aPtr->y)) bPtr++;

        count = bPtr - b.data();
        if (count) copy(b.data(), count, mSpans);

        // update a and b object
        a = {aPtr, size_t(aEnd - aPtr)};
        b = {bPtr, size_t(bEnd - bPtr)};

        // 3. calculate the intersect region
        Result result;

        // run till all the spans are processed
        while (a.size() && b.size()) {
            auto count = _opGeneric(a, b, result, op);
            if (count) copy(result.data(), count, mSpans);
        }
        // 3. copy the rest
        if (b.size()) copy(b.data(), b.size(), mSpans);
        if (a.size()) copy(a.data(), a.size(), mSpans);
    }

    mBboxDirty = true;
}